

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

result_type __thiscall
pstore::json::parser<pstore::json::null_output>::eof(parser<pstore::json::null_output> *this)

{
  matcher<pstore::json::null_output> *pmVar1;
  int line;
  _Elt_pointer puVar2;
  pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
  res;
  ushort local_52;
  char *local_50;
  unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  local_48;
  char local_38;
  
  local_50 = "handler->is_done ()";
  while( true ) {
    puVar2 = (this->stack_).c.
             super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if ((puVar2 == (this->stack_).c.
                   super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur) ||
       ((this->error_)._M_value != 0)) {
      return;
    }
    if (puVar2 == (this->stack_).c.
                  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      puVar2 = (this->stack_).c.
               super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    pmVar1 = puVar2[-1]._M_t.
             super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
             .
             super__Head_base<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_false>
             ._M_head_impl;
    local_52 = 0;
    (*pmVar1->_vptr_matcher[2])(&local_48,pmVar1,this,&local_52);
    if ((char)local_52 == '\x01') {
      local_52 = local_52 & 0xff00;
    }
    if ((puVar2[-1]._M_t.
         super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
         .super__Head_base<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_false>.
        _M_head_impl)->state_ != 1) break;
    if (local_38 == '\0') {
      line = 0x740;
      local_50 = "res.second";
      goto LAB_00165457;
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>_>_>
    ::pop_back(&(this->stack_).c);
    std::
    unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
    ::~unique_ptr(&local_48);
  }
  line = 0x73f;
LAB_00165457:
  assert_failed(local_50,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                ,line);
}

Assistant:

auto parser<Callbacks>::eof () -> result_type {
            while (!stack_.empty () && !has_error ()) {
                auto & handler = stack_.top ();
                auto res = handler->consume (*this, nothing<char> ());
                PSTORE_ASSERT (handler->is_done ());
                PSTORE_ASSERT (res.second);
                stack_.pop (); // release the topmost matcher object.
            }
            return has_error () ? details::default_return<result_type>::get ()
                                : this->callbacks ().result ();
        }